

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::rfind_lower(StringRef *this,char C,size_t From)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  if (this->Length < From) {
    From = this->Length;
  }
  bVar3 = C | 0x20;
  if (0x19 < (byte)(C + 0xbfU)) {
    bVar3 = C;
  }
  do {
    sVar2 = From - 1;
    if (From == 0) {
      return 0xffffffffffffffff;
    }
    bVar1 = this->Data[From - 1];
    bVar4 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar4 = bVar1;
    }
    From = sVar2;
  } while (bVar4 != bVar3);
  return sVar2;
}

Assistant:

size_t StringRef::rfind_lower(char C, size_t From) const {
  From = std::min(From, Length);
  size_t i = From;
  while (i != 0) {
    --i;
    if (toLower(Data[i]) == toLower(C))
      return i;
  }
  return npos;
}